

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O2

gint events_array_compare_function(gconstpointer aa,gconstpointer bb)

{
  int iVar1;
  int iVar2;
  
  iVar1 = *(int *)(*bb + 0x10);
  iVar2 = *(int *)(*aa + 0x10);
  if (iVar1 <= iVar2) {
    if (iVar1 < iVar2) {
      return 1;
    }
    iVar1 = *(int *)(*bb + 8);
    iVar2 = *(int *)(*aa + 8);
    if (iVar1 <= iVar2) {
      return (gint)(iVar1 < iVar2);
    }
  }
  return -1;
}

Assistant:

static gint
events_array_compare_function(gconstpointer aa, gconstpointer bb)
{
	smf_event_t *a, *b;
	
	/* "The comparison function for g_ptr_array_sort() doesn't take the pointers
	    from the array as arguments, it takes pointers to the pointers in the array." */
	a = (smf_event_t *)*(gpointer *)aa;
	b = (smf_event_t *)*(gpointer *)bb;

	if (a->time_pulses < b->time_pulses)
		return (-1);

	if (a->time_pulses > b->time_pulses)
		return (1);

	/*
	 * We need to preserve original order, otherwise things will break
	 * when there are several events with the same ->time_pulses.
	 * XXX: This is an ugly hack; we should remove sorting altogether.
	 */

	if (a->event_number < b->event_number)
		return (-1);

	if (a->event_number > b->event_number)
		return (1);

	return (0);
}